

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleUploadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  undefined1 *this_01;
  cmMakefile *pcVar1;
  CURL_conflict *pCVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  reference pbVar6;
  string *psVar7;
  char *pcVar8;
  undefined8 uVar9;
  ulong uVar10;
  ostream *poVar11;
  value_type local_912 [2];
  string local_910 [8];
  string log;
  ostringstream local_8d0 [8];
  ostringstream result;
  string *h;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  curl_slist *headers;
  string *local_710;
  string *netrc_option_err;
  allocator<char> local_6e1;
  undefined1 local_6e0 [8];
  string e_15;
  undefined1 local_6b8 [8];
  string e_14;
  undefined1 local_690 [8];
  string e_13;
  undefined1 local_668 [8];
  string e_12;
  undefined1 local_640 [8];
  string e_11;
  undefined1 local_618 [8];
  string e_10;
  cURLProgressHelper helper;
  undefined1 local_5c0 [8];
  string e_9;
  undefined1 local_598 [8];
  string e_8;
  undefined1 local_570 [8];
  string e_7;
  undefined1 local_548 [8];
  string e_6;
  undefined1 local_520 [8];
  string e_5;
  cmFileCommandVectorOfChar chunkDebug;
  cmFileCommandVectorOfChar chunkResponse;
  undefined1 local_4c8 [8];
  string e_4;
  undefined1 local_4a0 [8];
  string e_3;
  undefined1 local_478 [8];
  string e_2;
  undefined1 local_450 [8];
  string e_1;
  undefined1 local_428 [8];
  string e;
  CURLcode res;
  cURLEasyGuard g_curl;
  string local_3f0;
  CURL_conflict *local_3d0;
  CURL *curl;
  unsigned_long file_size;
  allocator<char> local_399;
  undefined1 local_398 [8];
  string errStr;
  FILE *fin;
  undefined1 local_368 [8];
  string err;
  string local_340;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_320;
  allocator<char> local_311;
  string local_310;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f0;
  allocator<char> local_2e1;
  string local_2e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c0;
  allocator<char> local_2b1;
  string local_2b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_290;
  allocator<char> local_281;
  string local_280;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  allocator<char> local_251;
  string local_250;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  allocator<char> local_221;
  string local_220;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_200;
  undefined4 local_1f8;
  allocator<char> local_1f1;
  string local_1f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  undefined1 local_1c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string local_1a0;
  undefined1 local_180 [8];
  string netrc_file;
  string local_158;
  undefined1 local_138 [8];
  string netrc_level;
  string userpwd;
  undefined1 local_f0 [7];
  bool showProgress;
  string statusVar;
  string logVar;
  long inactivity_timeout;
  long timeout;
  string url;
  string filename;
  const_iterator i;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar5 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"UPLOAD must be called with at least three arguments.",&local_41)
    ;
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
    goto LAB_002c296f;
  }
  filename.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(local_20);
  this_00 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(&filename.field_2._M_allocated_capacity + 1);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(this_00);
  pbVar6 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(this_00);
  std::__cxx11::string::string((string *)(url.field_2._M_local_buf + 8),(string *)pbVar6);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(this_00);
  pbVar6 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(this_00);
  std::__cxx11::string::string((string *)&timeout,(string *)pbVar6);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&filename.field_2 + 8));
  inactivity_timeout = 0;
  logVar.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f0);
  bVar4 = false;
  std::__cxx11::string::string((string *)(netrc_level.field_2._M_local_buf + 8));
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"CMAKE_NETRC",
             (allocator<char> *)(netrc_file.field_2._M_local_buf + 0xf));
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_158);
  std::__cxx11::string::string((string *)local_138,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)(netrc_file.field_2._M_local_buf + 0xf));
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"CMAKE_NETRC_FILE",
             (allocator<char> *)
             ((long)&curl_headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_1a0);
  std::__cxx11::string::string((string *)local_180,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&curl_headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1c0);
  while( true ) {
    local_1c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_20);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&filename.field_2 + 8),&local_1c8);
    if (!bVar3) break;
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8));
    bVar3 = std::operator==(pbVar6,"TIMEOUT");
    if (bVar3) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&filename.field_2 + 8));
      local_1d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_20);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8),&local_1d0);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,"UPLOAD missing time for TIMEOUT.",&local_1f1);
        cmCommand::SetError(&this->super_cmCommand,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
        this_local._7_1_ = 0;
        local_1f8 = 1;
        goto LAB_002c28b1;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&filename.field_2 + 8));
      pcVar8 = (char *)std::__cxx11::string::c_str();
      inactivity_timeout = atol(pcVar8);
    }
    else {
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&filename.field_2 + 8));
      bVar3 = std::operator==(pbVar6,"INACTIVITY_TIMEOUT");
      if (bVar3) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&filename.field_2 + 8));
        local_200._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(local_20);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&filename.field_2 + 8),&local_200);
        if (!bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_220,"UPLOAD missing time for INACTIVITY_TIMEOUT.",&local_221);
          cmCommand::SetError(&this->super_cmCommand,&local_220);
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator(&local_221);
          this_local._7_1_ = 0;
          local_1f8 = 1;
          goto LAB_002c28b1;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&filename.field_2 + 8));
        pcVar8 = (char *)std::__cxx11::string::c_str();
        logVar.field_2._8_8_ = atol(pcVar8);
      }
      else {
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8));
        bVar3 = std::operator==(pbVar6,"LOG");
        if (bVar3) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&filename.field_2 + 8));
          local_230._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_20);
          bVar3 = __gnu_cxx::operator==
                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8),&local_230);
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_250,"UPLOAD missing VAR for LOG.",&local_251);
            cmCommand::SetError(&this->super_cmCommand,&local_250);
            std::__cxx11::string::~string((string *)&local_250);
            std::allocator<char>::~allocator(&local_251);
            this_local._7_1_ = 0;
            local_1f8 = 1;
            goto LAB_002c28b1;
          }
          pbVar6 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(statusVar.field_2._M_local_buf + 8),(string *)pbVar6);
        }
        else {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
          bVar3 = std::operator==(pbVar6,"STATUS");
          if (bVar3) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&filename.field_2 + 8));
            local_260._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(local_20);
            bVar3 = __gnu_cxx::operator==
                              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8),&local_260);
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_280,"UPLOAD missing VAR for STATUS.",&local_281);
              cmCommand::SetError(&this->super_cmCommand,&local_280);
              std::__cxx11::string::~string((string *)&local_280);
              std::allocator<char>::~allocator(&local_281);
              this_local._7_1_ = 0;
              local_1f8 = 1;
              goto LAB_002c28b1;
            }
            pbVar6 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
            std::__cxx11::string::operator=((string *)local_f0,(string *)pbVar6);
          }
          else {
            pbVar6 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
            bVar3 = std::operator==(pbVar6,"SHOW_PROGRESS");
            if (bVar3) {
              bVar4 = true;
            }
            else {
              pbVar6 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&filename.field_2 + 8));
              bVar3 = std::operator==(pbVar6,"NETRC_FILE");
              if (bVar3) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&filename.field_2 + 8));
                local_290._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(local_20);
                bVar3 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&filename.field_2 + 8),&local_290);
                if (!bVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2b0,"UPLOAD missing file value for NETRC_FILE.",
                             &local_2b1);
                  cmCommand::SetError(&this->super_cmCommand,&local_2b0);
                  std::__cxx11::string::~string((string *)&local_2b0);
                  std::allocator<char>::~allocator(&local_2b1);
                  this_local._7_1_ = 0;
                  local_1f8 = 1;
                  goto LAB_002c28b1;
                }
                pbVar6 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8));
                std::__cxx11::string::operator=((string *)local_180,(string *)pbVar6);
              }
              else {
                pbVar6 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8));
                bVar3 = std::operator==(pbVar6,"NETRC");
                if (bVar3) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&filename.field_2 + 8));
                  local_2c0._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(local_20);
                  bVar3 = __gnu_cxx::operator!=
                                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)((long)&filename.field_2 + 8),&local_2c0);
                  if (!bVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_2e0,"UPLOAD missing level value for NETRC.",
                               &local_2e1);
                    cmCommand::SetError(&this->super_cmCommand,&local_2e0);
                    std::__cxx11::string::~string((string *)&local_2e0);
                    std::allocator<char>::~allocator(&local_2e1);
                    this_local._7_1_ = 0;
                    local_1f8 = 1;
                    goto LAB_002c28b1;
                  }
                  pbVar6 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8));
                  std::__cxx11::string::operator=((string *)local_138,(string *)pbVar6);
                }
                else {
                  pbVar6 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8));
                  bVar3 = std::operator==(pbVar6,"USERPWD");
                  if (bVar3) {
                    __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&filename.field_2 + 8));
                    local_2f0._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end(local_20);
                    bVar3 = __gnu_cxx::operator==
                                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)((long)&filename.field_2 + 8),&local_2f0);
                    if (bVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_310,"UPLOAD missing string for USERPWD.",
                                 &local_311);
                      cmCommand::SetError(&this->super_cmCommand,&local_310);
                      std::__cxx11::string::~string((string *)&local_310);
                      std::allocator<char>::~allocator(&local_311);
                      this_local._7_1_ = 0;
                      local_1f8 = 1;
                      goto LAB_002c28b1;
                    }
                    pbVar6 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)((long)&filename.field_2 + 8));
                    std::__cxx11::string::operator=
                              ((string *)(netrc_level.field_2._M_local_buf + 8),(string *)pbVar6);
                  }
                  else {
                    pbVar6 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)((long)&filename.field_2 + 8));
                    bVar3 = std::operator==(pbVar6,"HTTPHEADER");
                    if (bVar3) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)((long)&filename.field_2 + 8));
                      local_320._M_current =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end(local_20);
                      bVar3 = __gnu_cxx::operator==
                                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)((long)&filename.field_2 + 8),&local_320);
                      if (bVar3) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_340,"UPLOAD missing string for HTTPHEADER.",
                                   (allocator<char> *)(err.field_2._M_local_buf + 0xf));
                        cmCommand::SetError(&this->super_cmCommand,&local_340);
                        std::__cxx11::string::~string((string *)&local_340);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)(err.field_2._M_local_buf + 0xf));
                        this_local._7_1_ = 0;
                        local_1f8 = 1;
                        goto LAB_002c28b1;
                      }
                      pbVar6 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)((long)&filename.field_2 + 8));
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_1c0,pbVar6);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_368,"Unexpected argument: ",
                                 (allocator<char> *)((long)&fin + 7));
                      std::allocator<char>::~allocator((allocator<char> *)((long)&fin + 7));
                      pbVar6 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)((long)&filename.field_2 + 8));
                      std::__cxx11::string::operator+=((string *)local_368,(string *)pbVar6);
                      cmMakefile::IssueMessage
                                ((this->super_cmCommand).Makefile,AUTHOR_WARNING,(string *)local_368
                                );
                      std::__cxx11::string::~string((string *)local_368);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&filename.field_2 + 8));
  }
  errStr.field_2._8_8_ = cmsys::SystemTools::Fopen((string *)((long)&url.field_2 + 8),"rb");
  if ((FILE *)errStr.field_2._8_8_ == (FILE *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_398,"UPLOAD cannot open file \'",&local_399);
    std::allocator<char>::~allocator(&local_399);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_size,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&url.field_2 + 8),"\' for reading.");
    std::__cxx11::string::operator+=((string *)local_398,(string *)&file_size);
    std::__cxx11::string::~string((string *)&file_size);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_398);
    this_local._7_1_ = 0;
    local_1f8 = 1;
    std::__cxx11::string::~string((string *)local_398);
  }
  else {
    curl = (CURL *)cmsys::SystemTools::FileLength((string *)((long)&url.field_2 + 8));
    curl_global_init(3);
    local_3d0 = curl_easy_init();
    if (local_3d0 == (CURL_conflict *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f0,"UPLOAD error initializing curl.",
                 (allocator<char> *)((long)&g_curl.Easy + 7));
      cmCommand::SetError(&this->super_cmCommand,&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&g_curl.Easy + 7));
      fclose((FILE *)errStr.field_2._8_8_);
      this_local._7_1_ = 0;
      local_1f8 = 1;
    }
    else {
      anon_unknown.dwarf_353d22::cURLEasyGuard::cURLEasyGuard
                ((cURLEasyGuard *)&stack0xfffffffffffffc00,local_3d0);
      e.field_2._12_4_ = curl_easy_setopt(local_3d0,CURLOPT_FAILONERROR,1);
      if (e.field_2._12_4_ == CURLE_OK) {
        e.field_2._12_4_ = curl_easy_setopt(local_3d0,CURLOPT_UPLOAD,1);
        pCVar2 = local_3d0;
        if (e.field_2._12_4_ == CURLE_OK) {
          uVar9 = std::__cxx11::string::c_str();
          e.field_2._12_4_ = curl_easy_setopt(pCVar2,CURLOPT_URL,uVar9);
          if (e.field_2._12_4_ == CURLE_OK) {
            e.field_2._12_4_ =
                 curl_easy_setopt(local_3d0,CURLOPT_WRITEFUNCTION,
                                  anon_unknown.dwarf_353d22::cmWriteToMemoryCallback);
            if (e.field_2._12_4_ == CURLE_OK) {
              e.field_2._12_4_ =
                   curl_easy_setopt(local_3d0,CURLOPT_DEBUGFUNCTION,
                                    anon_unknown.dwarf_353d22::cmFileCommandCurlDebugCallback);
              if (e.field_2._12_4_ == CURLE_OK) {
                this_01 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x10;
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)this_01);
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)((long)&e_5.field_2 + 8));
                e.field_2._12_4_ = curl_easy_setopt(local_3d0,CURLOPT_WRITEDATA,this_01);
                if (e.field_2._12_4_ == CURLE_OK) {
                  e.field_2._12_4_ =
                       curl_easy_setopt(local_3d0,CURLOPT_DEBUGDATA,
                                        (undefined1 *)((long)&e_5.field_2 + 8));
                  if (e.field_2._12_4_ == CURLE_OK) {
                    e.field_2._12_4_ = curl_easy_setopt(local_3d0,CURLOPT_FOLLOWLOCATION,1);
                    if (e.field_2._12_4_ == CURLE_OK) {
                      uVar10 = std::__cxx11::string::empty();
                      if ((uVar10 & 1) == 0) {
                        e.field_2._12_4_ = curl_easy_setopt(local_3d0,CURLOPT_VERBOSE,1);
                        if (e.field_2._12_4_ != CURLE_OK) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_598,"UPLOAD cannot set verbose: ",
                                     (allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                          pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                          std::__cxx11::string::operator+=((string *)local_598,pcVar8);
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_598);
                          this_local._7_1_ = 0;
                          local_1f8 = 1;
                          std::__cxx11::string::~string((string *)local_598);
                          goto LAB_002c2861;
                        }
                        e.field_2._12_4_ = 0;
                      }
                      if (0 < inactivity_timeout) {
                        e.field_2._12_4_ =
                             curl_easy_setopt(local_3d0,CURLOPT_TIMEOUT,inactivity_timeout);
                        if (e.field_2._12_4_ != CURLE_OK) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_5c0,"UPLOAD cannot set timeout: ",
                                     (allocator<char> *)(helper.Text.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(helper.Text.field_2._M_local_buf + 0xf));
                          pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                          std::__cxx11::string::operator+=((string *)local_5c0,pcVar8);
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_5c0);
                          this_local._7_1_ = 0;
                          local_1f8 = 1;
                          std::__cxx11::string::~string((string *)local_5c0);
                          goto LAB_002c2861;
                        }
                        e.field_2._12_4_ = 0;
                      }
                      if (0 < (long)logVar.field_2._8_8_) {
                        curl_easy_setopt(local_3d0,CURLOPT_LOW_SPEED_LIMIT,1);
                        curl_easy_setopt(local_3d0,CURLOPT_LOW_SPEED_TIME,logVar.field_2._8_8_);
                      }
                      anon_unknown.dwarf_353d22::cURLProgressHelper::cURLProgressHelper
                                ((cURLProgressHelper *)((long)&e_10.field_2 + 8),this,"upload");
                      if (bVar4) {
                        e.field_2._12_4_ = curl_easy_setopt(local_3d0,CURLOPT_NOPROGRESS,0);
                        if (e.field_2._12_4_ == CURLE_OK) {
                          e.field_2._12_4_ =
                               curl_easy_setopt(local_3d0,CURLOPT_PROGRESSFUNCTION,
                                                anon_unknown.dwarf_353d22::
                                                cmFileUploadProgressCallback);
                          if (e.field_2._12_4_ == CURLE_OK) {
                            e.field_2._12_4_ =
                                 curl_easy_setopt(local_3d0,CURLOPT_PROGRESSDATA,
                                                  (undefined1 *)((long)&e_10.field_2 + 8));
                            if (e.field_2._12_4_ == CURLE_OK) {
                              e.field_2._12_4_ = 0;
                              goto LAB_002c201a;
                            }
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_668,"UPLOAD cannot set progress data: ",
                                       (allocator<char> *)(e_13.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(e_13.field_2._M_local_buf + 0xf));
                            pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                            std::__cxx11::string::operator+=((string *)local_668,pcVar8);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_668);
                            this_local._7_1_ = 0;
                            local_1f8 = 1;
                            std::__cxx11::string::~string((string *)local_668);
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_640,"UPLOAD cannot set progress function: ",
                                       (allocator<char> *)(e_12.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(e_12.field_2._M_local_buf + 0xf));
                            pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                            std::__cxx11::string::operator+=((string *)local_640,pcVar8);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_640);
                            this_local._7_1_ = 0;
                            local_1f8 = 1;
                            std::__cxx11::string::~string((string *)local_640);
                          }
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_618,"UPLOAD cannot set noprogress value: ",
                                     (allocator<char> *)(e_11.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(e_11.field_2._M_local_buf + 0xf));
                          pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                          std::__cxx11::string::operator+=((string *)local_618,pcVar8);
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                          this_local._7_1_ = 0;
                          local_1f8 = 1;
                          std::__cxx11::string::~string((string *)local_618);
                        }
                      }
                      else {
LAB_002c201a:
                        e.field_2._12_4_ =
                             curl_easy_setopt(local_3d0,CURLOPT_READDATA,errStr.field_2._8_8_);
                        if (e.field_2._12_4_ == CURLE_OK) {
                          e.field_2._12_4_ = curl_easy_setopt(local_3d0,CURLOPT_INFILESIZE,curl);
                          if (e.field_2._12_4_ == CURLE_OK) {
                            uVar10 = std::__cxx11::string::empty();
                            pCVar2 = local_3d0;
                            if ((uVar10 & 1) == 0) {
                              uVar9 = std::__cxx11::string::c_str();
                              e.field_2._12_4_ = curl_easy_setopt(pCVar2,CURLOPT_USERPWD,uVar9);
                              if (e.field_2._12_4_ != CURLE_OK) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)local_6e0,"UPLOAD cannot set user password: ",
                                           &local_6e1);
                                std::allocator<char>::~allocator(&local_6e1);
                                pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                std::__cxx11::string::operator+=((string *)local_6e0,pcVar8);
                                cmCommand::SetError(&this->super_cmCommand,(string *)local_6e0);
                                this_local._7_1_ = 0;
                                local_1f8 = 1;
                                std::__cxx11::string::~string((string *)local_6e0);
                                goto LAB_002c2845;
                              }
                            }
                            cmsys::SystemTools::UpperCase
                                      ((string *)&netrc_option_err,(string *)local_138);
                            std::__cxx11::string::operator=
                                      ((string *)local_138,(string *)&netrc_option_err);
                            std::__cxx11::string::~string((string *)&netrc_option_err);
                            cmCurlSetNETRCOption
                                      ((string *)&headers,local_3d0,(string *)local_138,
                                       (string *)local_180);
                            local_710 = (string *)&headers;
                            uVar10 = std::__cxx11::string::empty();
                            if ((uVar10 & 1) == 0) {
                              cmCommand::SetError(&this->super_cmCommand,local_710);
                              this_local._7_1_ = 0;
                            }
                            else {
                              __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)0x0;
                              __end1 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_1c0);
                              h = (string *)
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_1c0);
                              while (bVar4 = __gnu_cxx::operator!=
                                                       (&__end1,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&h), bVar4) {
                                __gnu_cxx::
                                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator*(&__end1);
                                pcVar8 = (char *)std::__cxx11::string::c_str();
                                __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)curl_slist_append((curl_slist *)__range1,pcVar8);
                                __gnu_cxx::
                                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator++(&__end1);
                              }
                              curl_easy_setopt(local_3d0,CURLOPT_HTTPHEADER,__range1);
                              e.field_2._12_4_ = curl_easy_perform(local_3d0);
                              curl_slist_free_all((curl_slist *)__range1);
                              anon_unknown.dwarf_353d22::cURLEasyGuard::release
                                        ((cURLEasyGuard *)&stack0xfffffffffffffc00);
                              curl_easy_cleanup(local_3d0);
                              uVar10 = std::__cxx11::string::empty();
                              if ((uVar10 & 1) == 0) {
                                std::__cxx11::ostringstream::ostringstream(local_8d0);
                                poVar11 = (ostream *)
                                          std::ostream::operator<<(local_8d0,e.field_2._12_4_);
                                poVar11 = std::operator<<(poVar11,";\"");
                                pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                                poVar11 = std::operator<<(poVar11,pcVar8);
                                std::operator<<(poVar11,"\"");
                                pcVar1 = (this->super_cmCommand).Makefile;
                                std::__cxx11::ostringstream::str();
                                pcVar8 = (char *)std::__cxx11::string::c_str();
                                cmMakefile::AddDefinition(pcVar1,(string *)local_f0,pcVar8);
                                std::__cxx11::string::~string
                                          ((string *)(log.field_2._M_local_buf + 8));
                                std::__cxx11::ostringstream::~ostringstream(local_8d0);
                              }
                              curl_global_cleanup();
                              fclose((FILE *)errStr.field_2._8_8_);
                              errStr.field_2._8_8_ = 0;
                              uVar10 = std::__cxx11::string::empty();
                              if ((uVar10 & 1) == 0) {
                                std::__cxx11::string::string(local_910);
                                bVar4 = std::vector<char,_std::allocator<char>_>::empty
                                                  ((vector<char,_std::allocator<char>_> *)
                                                   &chunkDebug.
                                                    super__Vector_base<char,_std::allocator<char>_>.
                                                    _M_impl.field_0x10);
                                if (!bVar4) {
                                  local_912[1] = 0;
                                  std::vector<char,_std::allocator<char>_>::push_back
                                            ((vector<char,_std::allocator<char>_> *)
                                             &chunkDebug.
                                              super__Vector_base<char,_std::allocator<char>_>.
                                              _M_impl.field_0x10,local_912 + 1);
                                  std::__cxx11::string::operator+=(local_910,"Response:\n");
                                  pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                     ((vector<char,_std::allocator<char>_> *)
                                                      &chunkDebug.
                                                                                                              
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.field_0x10);
                                  std::__cxx11::string::operator+=(local_910,pcVar8);
                                  std::__cxx11::string::operator+=(local_910,"\n");
                                }
                                bVar4 = std::vector<char,_std::allocator<char>_>::empty
                                                  ((vector<char,_std::allocator<char>_> *)
                                                   ((long)&e_5.field_2 + 8));
                                if (!bVar4) {
                                  local_912[0] = '\0';
                                  std::vector<char,_std::allocator<char>_>::push_back
                                            ((vector<char,_std::allocator<char>_> *)
                                             ((long)&e_5.field_2 + 8),local_912);
                                  std::__cxx11::string::operator+=(local_910,"Debug:\n");
                                  pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                     ((vector<char,_std::allocator<char>_> *)
                                                      ((long)&e_5.field_2 + 8));
                                  std::__cxx11::string::operator+=(local_910,pcVar8);
                                  std::__cxx11::string::operator+=(local_910,"\n");
                                }
                                pcVar1 = (this->super_cmCommand).Makefile;
                                pcVar8 = (char *)std::__cxx11::string::c_str();
                                cmMakefile::AddDefinition
                                          (pcVar1,(string *)((long)&statusVar.field_2 + 8),pcVar8);
                                std::__cxx11::string::~string(local_910);
                              }
                              this_local._7_1_ = 1;
                            }
                            local_1f8 = 1;
                            std::__cxx11::string::~string((string *)&headers);
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_6b8,"UPLOAD cannot set input file size: ",
                                       (allocator<char> *)(e_15.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(e_15.field_2._M_local_buf + 0xf));
                            pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                            std::__cxx11::string::operator+=((string *)local_6b8,pcVar8);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_6b8);
                            this_local._7_1_ = 0;
                            local_1f8 = 1;
                            std::__cxx11::string::~string((string *)local_6b8);
                          }
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)local_690,"UPLOAD cannot set input file: ",
                                     (allocator<char> *)(e_14.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(e_14.field_2._M_local_buf + 0xf));
                          pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                          std::__cxx11::string::operator+=((string *)local_690,pcVar8);
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_690);
                          this_local._7_1_ = 0;
                          local_1f8 = 1;
                          std::__cxx11::string::~string((string *)local_690);
                        }
                      }
LAB_002c2845:
                      anon_unknown.dwarf_353d22::cURLProgressHelper::~cURLProgressHelper
                                ((cURLProgressHelper *)((long)&e_10.field_2 + 8));
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_570,"UPLOAD cannot set follow-redirect option: ",
                                 (allocator<char> *)(e_8.field_2._M_local_buf + 0xf));
                      std::allocator<char>::~allocator
                                ((allocator<char> *)(e_8.field_2._M_local_buf + 0xf));
                      pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                      std::__cxx11::string::operator+=((string *)local_570,pcVar8);
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_570);
                      this_local._7_1_ = 0;
                      local_1f8 = 1;
                      std::__cxx11::string::~string((string *)local_570);
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_548,"UPLOAD cannot set debug data: ",
                               (allocator<char> *)(e_7.field_2._M_local_buf + 0xf));
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(e_7.field_2._M_local_buf + 0xf));
                    pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                    std::__cxx11::string::operator+=((string *)local_548,pcVar8);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_548);
                    this_local._7_1_ = 0;
                    local_1f8 = 1;
                    std::__cxx11::string::~string((string *)local_548);
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_520,"UPLOAD cannot set write data: ",
                             (allocator<char> *)(e_6.field_2._M_local_buf + 0xf));
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(e_6.field_2._M_local_buf + 0xf));
                  pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                  std::__cxx11::string::operator+=((string *)local_520,pcVar8);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_520);
                  this_local._7_1_ = 0;
                  local_1f8 = 1;
                  std::__cxx11::string::~string((string *)local_520);
                }
LAB_002c2861:
                std::vector<char,_std::allocator<char>_>::~vector
                          ((vector<char,_std::allocator<char>_> *)((long)&e_5.field_2 + 8));
                std::vector<char,_std::allocator<char>_>::~vector
                          ((vector<char,_std::allocator<char>_> *)
                           &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_4c8,"UPLOAD cannot set debug function: ",
                           (allocator<char> *)
                           &chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x17);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           &chunkResponse.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x17);
                pcVar8 = curl_easy_strerror(e.field_2._12_4_);
                std::__cxx11::string::operator+=((string *)local_4c8,pcVar8);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_4c8);
                this_local._7_1_ = 0;
                local_1f8 = 1;
                std::__cxx11::string::~string((string *)local_4c8);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_4a0,"UPLOAD cannot set write function: ",
                         (allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator((allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
              pcVar8 = curl_easy_strerror(e.field_2._12_4_);
              std::__cxx11::string::operator+=((string *)local_4a0,pcVar8);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_4a0);
              this_local._7_1_ = 0;
              local_1f8 = 1;
              std::__cxx11::string::~string((string *)local_4a0);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_478,"UPLOAD cannot set url: ",
                       (allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator((allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
            pcVar8 = curl_easy_strerror(e.field_2._12_4_);
            std::__cxx11::string::operator+=((string *)local_478,pcVar8);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_478);
            this_local._7_1_ = 0;
            local_1f8 = 1;
            std::__cxx11::string::~string((string *)local_478);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_450,"UPLOAD cannot set upload flag: ",
                     (allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
          pcVar8 = curl_easy_strerror(e.field_2._12_4_);
          std::__cxx11::string::operator+=((string *)local_450,pcVar8);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_450);
          this_local._7_1_ = 0;
          local_1f8 = 1;
          std::__cxx11::string::~string((string *)local_450);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_428,"UPLOAD cannot set fail on error flag: ",
                   (allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
        pcVar8 = curl_easy_strerror(e.field_2._12_4_);
        std::__cxx11::string::operator+=((string *)local_428,pcVar8);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_428);
        this_local._7_1_ = 0;
        local_1f8 = 1;
        std::__cxx11::string::~string((string *)local_428);
      }
      anon_unknown.dwarf_353d22::cURLEasyGuard::~cURLEasyGuard
                ((cURLEasyGuard *)&stack0xfffffffffffffc00);
    }
  }
LAB_002c28b1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c0);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)(netrc_level.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&timeout);
  std::__cxx11::string::~string((string *)(url.field_2._M_local_buf + 8));
LAB_002c296f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleUploadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if (args.size() < 3) {
    this->SetError("UPLOAD must be called with at least three arguments.");
    return false;
  }
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;
  std::string userpwd;
  std::string netrc_level = this->Makefile->GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    this->Makefile->GetSafeDefinition("CMAKE_NETRC_FILE");

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        this->SetError("UPLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        this->SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        this->SetError("UPLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        this->SetError("UPLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        this->SetError("UPLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = "Unexpected argument: ";
      err += *i;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, err);
    }

    ++i;
  }

  // Open file for reading:
  //
  FILE* fin = cmsys::SystemTools::Fopen(filename, "rb");
  if (!fin) {
    std::string errStr = "UPLOAD cannot open file '";
    errStr += filename + "' for reading.";
    this->SetError(errStr);
    return false;
  }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

#  if defined(_WIN32)
  url = fix_file_url_windows(url);
#  endif

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    this->SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
  }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res =
    ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "UPLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "upload");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
  }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res =
    ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "UPLOAD cannot set user password: ");
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    this->SetError(netrc_option_err);
    return false;
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    std::ostringstream result;
    result << static_cast<int>(res) << ";\"" << ::curl_easy_strerror(res)
           << "\"";
    this->Makefile->AddDefinition(statusVar, result.str().c_str());
  }

  ::curl_global_cleanup();

  fclose(fin);
  fin = nullptr;

  if (!logVar.empty()) {
    std::string log;

    if (!chunkResponse.empty()) {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += chunkResponse.data();
      log += "\n";
    }

    if (!chunkDebug.empty()) {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += chunkDebug.data();
      log += "\n";
    }

    this->Makefile->AddDefinition(logVar, log.c_str());
  }

  return true;
#else
  this->SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}